

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

bool __thiscall Lexer::isDataType(Lexer *this)

{
  size_type sVar1;
  key_type local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&(this->lexem).value);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
          ::count(&this->DATA_TYPES,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return sVar1 != 0;
}

Assistant:

bool isDataType() {
        return DATA_TYPES.count(getLexemValue()) != 0;
    }